

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcases.c
# Opt level: O0

int test_map2json_array(void)

{
  int iVar1;
  char *pcVar2;
  map2json_t *map2jsonObj;
  char *in_stack_00000010;
  char *in_stack_00000018;
  map2json_t *in_stack_00000020;
  char *in_stack_fffffffffffffff0;
  uint local_4;
  
  map2json_init(in_stack_fffffffffffffff0);
  map2json_push(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  map2json_push(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  map2json_push(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  map2json_push(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  map2json_push(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  map2json_push(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  map2json_push(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  map2json_push(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  pcVar2 = map2json_create((map2json_t *)0x10271c);
  printf("Expected: \t%s\nActual: \t%s\n\n",
         "{\"array\":[{\"object1\":{\"key1\":\"value1\",\"key2\":2}},{\"array2\":[\"test\",\"test2\"]},\"b\",1]}"
         ,pcVar2);
  pcVar2 = map2json_create((map2json_t *)0x10273e);
  iVar1 = strcmp("{\"array\":[{\"object1\":{\"key1\":\"value1\",\"key2\":2}},{\"array2\":[\"test\",\"test2\"]},\"b\",1]}"
                 ,pcVar2);
  if (iVar1 == 0) {
    map2json_destroy((map2json_t *)0x102766);
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

int test_map2json_array() {
	map2json_t *map2jsonObj = map2json_init(NULL);
	map2json_push(map2jsonObj, "array[0].object1.key1", "value1");
	map2json_push(map2jsonObj, "array[0].object1.key2", "2");
	map2json_push(map2jsonObj, "array[3]", "1");
	map2json_push(map2jsonObj, "array[2]", "b");
	map2json_push(map2jsonObj, "array[1].array2[0]", "test");
	map2json_push(map2jsonObj, "array[1].array2[1]", "test2");
	map2json_push(map2jsonObj, "array[1].array2[x]", "2");
	map2json_push(map2jsonObj, "array[x]", "4");

	ASSERTSTR("{\"array\":[{\"object1\":{\"key1\":\"value1\",\"key2\":2}},{\"array2\":[\"test\",\"test2\"]},\"b\",1]}", map2json_create(map2jsonObj));
	map2json_destroy(map2jsonObj);
	return 0;
}